

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O2

Vec_Ptr_t *
Dar_ManChoiceSynthesis(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fPower,int fVerbose)

{
  Vec_Ptr_t *p;
  Aig_Man_t *pAVar1;
  
  p = Vec_PtrAlloc((int)pAig);
  pAVar1 = Aig_ManDupDfs(pAig);
  Vec_PtrPush(p,pAVar1);
  pAVar1 = Dar_ManCompress(pAVar1,fBalance,fUpdateLevel,fPower,fVerbose);
  Vec_PtrPush(p,pAVar1);
  pAVar1 = Dar_ManCompress2(pAVar1,fBalance,fUpdateLevel,1,fPower,fVerbose);
  Vec_PtrPush(p,pAVar1);
  Vec_PtrEntry(p,1);
  return p;
}

Assistant:

Vec_Ptr_t * Dar_ManChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fVerbose )
//alias resyn    "b; rw; rwz; b; rwz; b"
//alias resyn2   "b; rw; rf; b; rw; rwz; b; rfz; rwz; b"
{
    Vec_Ptr_t * vAigs;

    vAigs = Vec_PtrAlloc( 3 );
    pAig = Aig_ManDupDfs(pAig);
    Vec_PtrPush( vAigs, pAig );

    pAig = Dar_ManCompress(pAig, fBalance, fUpdateLevel, fPower, fVerbose);
    Vec_PtrPush( vAigs, pAig );
//Aig_ManPrintStats( pAig );

    pAig = Dar_ManCompress2(pAig, fBalance, fUpdateLevel, 1, fPower, fVerbose);
    Vec_PtrPush( vAigs, pAig );
//Aig_ManPrintStats( pAig );

    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 1 );
    return vAigs;
}